

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_rewriter.cpp
# Opt level: O2

void __thiscall
duckdb::SumRewriterOptimizer::SumRewriterOptimizer(SumRewriterOptimizer *this,Optimizer *optimizer)

{
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TypeMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var3;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ConstantExpressionMatcher_*,_false> _Var5;
  _Head_base<0UL,_duckdb::AggregateExpressionMatcher_*,_false> _Var6;
  pointer pAVar7;
  pointer pFVar8;
  pointer pCVar9;
  pointer pSVar10;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> local_48;
  _Head_base<0UL,_duckdb::ConstantExpressionMatcher_*,_false> local_40;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> local_38;
  _Head_base<0UL,_duckdb::AggregateExpressionMatcher_*,_false> local_30;
  _Head_base<0UL,_duckdb::StableExpressionMatcher_*,_false> local_28;
  
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor =
       (_func_int **)&PTR__SumRewriterOptimizer_0278be08;
  this->optimizer = optimizer;
  (this->aggregate_map)._M_h._M_buckets = &(this->aggregate_map)._M_h._M_single_bucket;
  (this->aggregate_map)._M_h._M_bucket_count = 1;
  (this->aggregate_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->aggregate_map)._M_h._M_element_count = 0;
  (this->aggregate_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->aggregate_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->aggregate_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sum_matcher).
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  make_uniq<duckdb::AggregateExpressionMatcher>();
  make_uniq<duckdb::SpecificFunctionMatcher,char_const(&)[4]>
            ((duckdb *)&local_38,(char (*) [4])0x20fd9dd);
  _Var4._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (FunctionExpressionMatcher *)0x0;
  pAVar7 = unique_ptr<duckdb::AggregateExpressionMatcher,_std::default_delete<duckdb::AggregateExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::AggregateExpressionMatcher,_std::default_delete<duckdb::AggregateExpressionMatcher>,_true>
                         *)&local_30);
  _Var1._M_head_impl =
       (pAVar7->function).
       super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>
       .super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl;
  (pAVar7->function).
  super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>.
  super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl =
       (FunctionMatcher *)_Var4._M_head_impl;
  if (_Var1._M_head_impl != (FunctionMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FunctionMatcher[1])();
  }
  if (local_38._M_head_impl != (FunctionExpressionMatcher *)0x0) {
    (*((local_38._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  pAVar7 = unique_ptr<duckdb::AggregateExpressionMatcher,_std::default_delete<duckdb::AggregateExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::AggregateExpressionMatcher,_std::default_delete<duckdb::AggregateExpressionMatcher>,_true>
                         *)&local_30);
  pAVar7->policy = UNORDERED;
  make_uniq<duckdb::FunctionExpressionMatcher>();
  make_uniq<duckdb::SpecificFunctionMatcher,char_const(&)[2]>
            ((duckdb *)&local_40,(char (*) [2])0x20f2ac6);
  _Var5._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ConstantExpressionMatcher *)0x0;
  pFVar8 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_38);
  _Var1._M_head_impl =
       (pFVar8->function).
       super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>
       .super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl;
  (pFVar8->function).
  super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>.
  super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl =
       (FunctionMatcher *)_Var5._M_head_impl;
  if (_Var1._M_head_impl != (FunctionMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FunctionMatcher[1])();
  }
  if (local_40._M_head_impl != (ConstantExpressionMatcher *)0x0) {
    (*((local_40._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::IntegerTypeMatcher>();
  _Var5._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ConstantExpressionMatcher *)0x0;
  pFVar8 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_38);
  _Var2._M_head_impl =
       (pFVar8->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pFVar8->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var5._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if ((FunctionExpressionMatcher *)local_40._M_head_impl != (FunctionExpressionMatcher *)0x0) {
    (*((local_40._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  make_uniq<duckdb::ConstantExpressionMatcher>();
  make_uniq<duckdb::StableExpressionMatcher>();
  GetSmallIntegerTypesMatcher();
  _Var4._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (FunctionExpressionMatcher *)0x0;
  pCVar9 = unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConstantExpressionMatcher,_std::default_delete<duckdb::ConstantExpressionMatcher>,_true>
                         *)&local_40);
  _Var2._M_head_impl =
       (pCVar9->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pCVar9->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var4._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_48._M_head_impl != (FunctionExpressionMatcher *)0x0) {
    (*((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  GetSmallIntegerTypesMatcher();
  _Var4._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (FunctionExpressionMatcher *)0x0;
  pSVar10 = unique_ptr<duckdb::StableExpressionMatcher,_std::default_delete<duckdb::StableExpressionMatcher>,_true>
            ::operator->((unique_ptr<duckdb::StableExpressionMatcher,_std::default_delete<duckdb::StableExpressionMatcher>,_true>
                          *)&local_28);
  _Var2._M_head_impl =
       (pSVar10->super_ExpressionMatcher).type.
       super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
       super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl;
  (pSVar10->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl =
       (TypeMatcher *)_Var4._M_head_impl;
  if (_Var2._M_head_impl != (TypeMatcher *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_TypeMatcher[1])();
  }
  if (local_48._M_head_impl != (FunctionExpressionMatcher *)0x0) {
    (*((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  pFVar8 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_38);
  local_48._M_head_impl = (FunctionExpressionMatcher *)local_40._M_head_impl;
  local_40._M_head_impl = (ConstantExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar8->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_48);
  if (local_48._M_head_impl != (FunctionExpressionMatcher *)0x0) {
    (*((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  pFVar8 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_38);
  local_48._M_head_impl = (FunctionExpressionMatcher *)local_28._M_head_impl;
  local_28._M_head_impl = (StableExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar8->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_48);
  if (local_48._M_head_impl != (FunctionExpressionMatcher *)0x0) {
    (*((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  pFVar8 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_38);
  pFVar8->policy = SOME;
  pAVar7 = unique_ptr<duckdb::AggregateExpressionMatcher,_std::default_delete<duckdb::AggregateExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::AggregateExpressionMatcher,_std::default_delete<duckdb::AggregateExpressionMatcher>,_true>
                         *)&local_30);
  local_48._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (FunctionExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pAVar7->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_48);
  if (local_48._M_head_impl != (FunctionExpressionMatcher *)0x0) {
    (*((local_48._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  _Var6._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (AggregateExpressionMatcher *)0x0;
  _Var3._M_head_impl =
       (this->sum_matcher).
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->sum_matcher).
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var6._M_head_impl)->super_ExpressionMatcher;
  if (_Var3._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_28._M_head_impl != (StableExpressionMatcher *)0x0) {
    (*((local_28._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_40._M_head_impl != (ConstantExpressionMatcher *)0x0) {
    (*((local_40._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_38._M_head_impl != (FunctionExpressionMatcher *)0x0) {
    (*((local_38._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_30._M_head_impl != (AggregateExpressionMatcher *)0x0) {
    (*((local_30._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

SumRewriterOptimizer::SumRewriterOptimizer(Optimizer &optimizer) : optimizer(optimizer) {
	// set up an expression matcher that detects SUM(x + C) or SUM(C + x)
	auto op = make_uniq<AggregateExpressionMatcher>();
	op->function = make_uniq<SpecificFunctionMatcher>("sum");
	op->policy = SetMatcher::Policy::UNORDERED;

	auto arithmetic = make_uniq<FunctionExpressionMatcher>();
	// handle X + C where
	arithmetic->function = make_uniq<SpecificFunctionMatcher>("+");
	// we match only on integral numeric types
	arithmetic->type = make_uniq<IntegerTypeMatcher>();
	auto child_constant_matcher = make_uniq<ConstantExpressionMatcher>();
	auto child_expression_matcher = make_uniq<StableExpressionMatcher>();
	child_constant_matcher->type = GetSmallIntegerTypesMatcher();
	child_expression_matcher->type = GetSmallIntegerTypesMatcher();
	arithmetic->matchers.push_back(std::move(child_constant_matcher));
	arithmetic->matchers.push_back(std::move(child_expression_matcher));
	arithmetic->policy = SetMatcher::Policy::SOME;
	op->matchers.push_back(std::move(arithmetic));

	sum_matcher = std::move(op);
}